

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void ManagerTest<uttt::IBoard,uttt::RandomPlayout>(void)

{
  bool bVar1;
  void *pvVar2;
  reference ppIVar3;
  reference plVar4;
  ostream *poVar5;
  double dVar6;
  longlong id_1;
  iterator __end2;
  iterator __begin2;
  vector<long_long,_std::allocator<long_long>_> *__range2;
  int i;
  int num_rounds;
  longlong id;
  iterator __end1;
  iterator __begin1;
  vector<long_long,_std::allocator<long_long>_> *__range1_1;
  IBot<uttt::IBoard> *bot;
  iterator __end0;
  iterator __begin0;
  vector<game::IBot<uttt::IBoard>_*,_std::allocator<game::IBot<uttt::IBoard>_*>_> *__range1;
  vector<long_long,_std::allocator<long_long>_> bot_ids;
  vector<game::IBot<uttt::IBoard>_*,_std::allocator<game::IBot<uttt::IBoard>_*>_> bots;
  Manager<uttt::IBoard> manager;
  IBoard game;
  vector<game::IBot<uttt::IBoard>_*,_std::allocator<game::IBot<uttt::IBoard>_*>_>
  *in_stack_fffffffffffffe78;
  Manager<uttt::IBoard> *in_stack_fffffffffffffe80;
  IBoard *in_stack_fffffffffffffe88;
  FixedMctsBot<uttt::IBoard,_std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_(*)(const_uttt::IBoard_&,_long_long)>
  *in_stack_fffffffffffffe90;
  IBoard *in_stack_fffffffffffffe98;
  Manager<uttt::IBoard> *in_stack_fffffffffffffea0;
  IBot<uttt::IBoard> *in_stack_fffffffffffffea8;
  Manager<uttt::IBoard> *in_stack_fffffffffffffeb0;
  __normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_> local_110;
  undefined1 *local_108;
  int local_100;
  int local_fc;
  longlong local_f8;
  longlong *local_f0;
  __normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_> local_e8;
  undefined1 *local_e0;
  longlong local_d8;
  IBot<uttt::IBoard> *local_d0;
  IBot<uttt::IBoard> **local_c8;
  __normal_iterator<game::IBot<uttt::IBoard>_**,_std::vector<game::IBot<uttt::IBoard>_*,_std::allocator<game::IBot<uttt::IBoard>_*>_>_>
  local_c0;
  undefined1 *local_b8;
  undefined1 local_b0 [24];
  void *local_98;
  code *local_90;
  void *local_78;
  undefined1 local_70 [112];
  
  uttt::IBoard::IBoard((IBoard *)in_stack_fffffffffffffe80);
  ::manager::Manager<uttt::IBoard>::Manager(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  std::vector<game::IBot<uttt::IBoard>_*,_std::allocator<game::IBot<uttt::IBoard>_*>_>::vector
            ((vector<game::IBot<uttt::IBoard>_*,_std::allocator<game::IBot<uttt::IBoard>_*>_> *)
             0x1f7ce8);
  pvVar2 = operator_new(0x20);
  local_90 = mcts::MCTS_parallel<uttt::IBoard,uttt::RandomPlayout>;
  generic_bots::
  FixedMctsBot<uttt::IBoard,_std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_(*)(const_uttt::IBoard_&,_long_long)>
  ::FixedMctsBot(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                 (_func_vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_IBoard_ptr_longlong
                  **)in_stack_fffffffffffffe80,(longlong)in_stack_fffffffffffffe78);
  local_78 = pvVar2;
  std::vector<game::IBot<uttt::IBoard>*,std::allocator<game::IBot<uttt::IBoard>*>>::
  emplace_back<generic_bots::FixedMctsBot<uttt::IBoard,std::vector<mcts::MCTSResults,std::allocator<mcts::MCTSResults>>(*)(uttt::IBoard_const&,long_long)>*>
            ((vector<game::IBot<uttt::IBoard>_*,_std::allocator<game::IBot<uttt::IBoard>_*>_> *)
             in_stack_fffffffffffffe90,
             (FixedMctsBot<uttt::IBoard,_std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_(*)(const_uttt::IBoard_&,_long_long)>
              **)in_stack_fffffffffffffe88);
  pvVar2 = operator_new(0x18);
  generic_bots::
  MinimaxBot<uttt::IBoard,_minimax::ABeta<uttt::IBoard,_minimax::Eval<uttt::IBoard>_>_>::MinimaxBot
            ((MinimaxBot<uttt::IBoard,_minimax::ABeta<uttt::IBoard,_minimax::Eval<uttt::IBoard>_>_>
              *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
             (int)((ulong)in_stack_fffffffffffffe80 >> 0x20));
  local_98 = pvVar2;
  std::vector<game::IBot<uttt::IBoard>*,std::allocator<game::IBot<uttt::IBoard>*>>::
  emplace_back<generic_bots::MinimaxBot<uttt::IBoard,minimax::ABeta<uttt::IBoard,minimax::Eval<uttt::IBoard>>>*>
            ((vector<game::IBot<uttt::IBoard>_*,_std::allocator<game::IBot<uttt::IBoard>_*>_> *)
             in_stack_fffffffffffffe90,
             (MinimaxBot<uttt::IBoard,_minimax::ABeta<uttt::IBoard,_minimax::Eval<uttt::IBoard>_>_>
              **)in_stack_fffffffffffffe88);
  std::vector<long_long,_std::allocator<long_long>_>::vector
            ((vector<long_long,_std::allocator<long_long>_> *)0x1f7da8);
  local_b8 = local_70;
  local_c0._M_current =
       (IBot<uttt::IBoard> **)
       std::vector<game::IBot<uttt::IBoard>_*,_std::allocator<game::IBot<uttt::IBoard>_*>_>::begin
                 (in_stack_fffffffffffffe78);
  local_c8 = (IBot<uttt::IBoard> **)
             std::vector<game::IBot<uttt::IBoard>_*,_std::allocator<game::IBot<uttt::IBoard>_*>_>::
             end(in_stack_fffffffffffffe78);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<game::IBot<uttt::IBoard>_**,_std::vector<game::IBot<uttt::IBoard>_*,_std::allocator<game::IBot<uttt::IBoard>_*>_>_>
                        *)in_stack_fffffffffffffe80,
                       (__normal_iterator<game::IBot<uttt::IBoard>_**,_std::vector<game::IBot<uttt::IBoard>_*,_std::allocator<game::IBot<uttt::IBoard>_*>_>_>
                        *)in_stack_fffffffffffffe78);
    if (!bVar1) break;
    ppIVar3 = __gnu_cxx::
              __normal_iterator<game::IBot<uttt::IBoard>_**,_std::vector<game::IBot<uttt::IBoard>_*,_std::allocator<game::IBot<uttt::IBoard>_*>_>_>
              ::operator*(&local_c0);
    local_d0 = *ppIVar3;
    local_d8 = ::manager::Manager<uttt::IBoard>::AddBot
                         (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    std::vector<long_long,_std::allocator<long_long>_>::emplace_back<long_long>
              ((vector<long_long,_std::allocator<long_long>_> *)in_stack_fffffffffffffe90,
               (longlong *)in_stack_fffffffffffffe88);
    if (local_d0 != (IBot<uttt::IBoard> *)0x0) {
      (*local_d0->_vptr_IBot[1])();
    }
    __gnu_cxx::
    __normal_iterator<game::IBot<uttt::IBoard>_**,_std::vector<game::IBot<uttt::IBoard>_*,_std::allocator<game::IBot<uttt::IBoard>_*>_>_>
    ::operator++(&local_c0);
  }
  std::operator<<((ostream *)&std::cout,"Initial ratings:");
  local_e0 = local_b0;
  local_e8._M_current =
       (longlong *)
       std::vector<long_long,_std::allocator<long_long>_>::begin
                 ((vector<long_long,_std::allocator<long_long>_> *)in_stack_fffffffffffffe78);
  local_f0 = (longlong *)
             std::vector<long_long,_std::allocator<long_long>_>::end
                       ((vector<long_long,_std::allocator<long_long>_> *)in_stack_fffffffffffffe78);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>
                        *)in_stack_fffffffffffffe80,
                       (__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>
                        *)in_stack_fffffffffffffe78);
    if (!bVar1) break;
    plVar4 = __gnu_cxx::
             __normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>::
             operator*(&local_e8);
    local_f8 = *plVar4;
    in_stack_fffffffffffffeb0 = (Manager<uttt::IBoard> *)std::operator<<((ostream *)&std::cout,' ');
    dVar6 = ::manager::Manager<uttt::IBoard>::GetBotRating
                      (in_stack_fffffffffffffe80,(longlong)in_stack_fffffffffffffe78);
    std::ostream::operator<<((ostream *)in_stack_fffffffffffffeb0,dVar6);
    __gnu_cxx::__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>::
    operator++(&local_e8);
  }
  std::operator<<((ostream *)&std::cout,'\n');
  local_fc = 200;
  for (local_100 = 0; local_100 < local_fc; local_100 = local_100 + 1) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Round ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_100 + 1);
    in_stack_fffffffffffffe90 =
         (FixedMctsBot<uttt::IBoard,_std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_(*)(const_uttt::IBoard_&,_long_long)>
          *)std::operator<<(poVar5," / ");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)in_stack_fffffffffffffe90,local_fc);
    std::operator<<(poVar5,'\n');
    ::manager::Manager<uttt::IBoard>::RoundRobin(in_stack_fffffffffffffeb0);
    std::operator<<((ostream *)&std::cout,"New ratings:");
    local_108 = local_b0;
    local_110._M_current =
         (longlong *)
         std::vector<long_long,_std::allocator<long_long>_>::begin
                   ((vector<long_long,_std::allocator<long_long>_> *)in_stack_fffffffffffffe78);
    std::vector<long_long,_std::allocator<long_long>_>::end
              ((vector<long_long,_std::allocator<long_long>_> *)in_stack_fffffffffffffe78);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>
                          *)in_stack_fffffffffffffe80,
                         (__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>
                          *)in_stack_fffffffffffffe78);
      if (!bVar1) break;
      __gnu_cxx::__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>
      ::operator*(&local_110);
      in_stack_fffffffffffffe80 =
           (Manager<uttt::IBoard> *)std::operator<<((ostream *)&std::cout,' ');
      in_stack_fffffffffffffe78 =
           (vector<game::IBot<uttt::IBoard>_*,_std::allocator<game::IBot<uttt::IBoard>_*>_> *)
           ::manager::Manager<uttt::IBoard>::GetBotRating
                     (in_stack_fffffffffffffe80,(longlong)in_stack_fffffffffffffe78);
      std::ostream::operator<<
                ((ostream *)in_stack_fffffffffffffe80,(double)in_stack_fffffffffffffe78);
      __gnu_cxx::__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>
      ::operator++(&local_110);
    }
    std::operator<<((ostream *)&std::cout,'\n');
  }
  std::vector<long_long,_std::allocator<long_long>_>::~vector
            ((vector<long_long,_std::allocator<long_long>_> *)in_stack_fffffffffffffe90);
  std::vector<game::IBot<uttt::IBoard>_*,_std::allocator<game::IBot<uttt::IBoard>_*>_>::~vector
            ((vector<game::IBot<uttt::IBoard>_*,_std::allocator<game::IBot<uttt::IBoard>_*>_> *)
             in_stack_fffffffffffffe90);
  ::manager::Manager<uttt::IBoard>::~Manager(in_stack_fffffffffffffeb0);
  return;
}

Assistant:

void
ManagerTest()
{
    IGame game;
    manager::Manager<IGame> manager(&game);

    std::vector<game::IBot<IGame> *> bots;
    bots.emplace_back(new generic_bots::FixedMctsBot<IGame, std::vector<mcts::MCTSResults> (*)(const IGame &, long long)>(&game, mcts::MCTS_parallel<IGame, RandomPlayout>, 1000));
    bots.emplace_back(new generic_bots::MinimaxBot<IGame, minimax::ABeta<IGame>>(&game, 9));

    std::vector<long long> bot_ids;
    for (auto bot : bots)
    {
        bot_ids.emplace_back(manager.AddBot(bot));
        delete bot;
    }

    std::cout << "Initial ratings:";
    for (long long id : bot_ids)
        std::cout << ' ' << manager.GetBotRating(id);
    std::cout << '\n';

    int num_rounds = 200;
    for (int i = 0; i < num_rounds; ++i)
    {
        std::cout << "Round " << i + 1 << " / " << num_rounds << '\n';
        manager.RoundRobin();
        std::cout << "New ratings:";
        for (long long id : bot_ids)
            std::cout << ' ' << manager.GetBotRating(id);
        std::cout << '\n';
    }
}